

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O1

int lua_getmetatable(lua_State *L,int idx)

{
  TValue *pTVar1;
  ulong *puVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  
  pTVar1 = index2adr(L,idx);
  uVar3 = pTVar1->it64 >> 0x2f;
  if ((uVar3 == 0xfffffffffffffff3) || (uVar3 == 0xfffffffffffffff4)) {
    puVar2 = (ulong *)((pTVar1->it64 & 0x7fffffffffffU) + 0x20);
  }
  else {
    lVar4 = 0x23;
    if (0xfffffffffffffff2 < uVar3) {
      lVar4 = 0x15 - uVar3;
    }
    puVar2 = (ulong *)((L->glref).ptr64 + lVar4 * 8 + 0x1a8);
  }
  if (*puVar2 == 0) {
    iVar5 = 0;
  }
  else {
    L->top->u64 = *puVar2 | 0xfffa000000000000;
    pTVar1 = L->top;
    L->top = pTVar1 + 1;
    iVar5 = 1;
    if ((TValue *)(L->maxstack).ptr64 <= pTVar1 + 1) {
      lj_state_growstack1(L);
    }
  }
  return iVar5;
}

Assistant:

LUA_API int lua_getmetatable(lua_State *L, int idx)
{
  cTValue *o = index2adr(L, idx);
  GCtab *mt = NULL;
  if (tvistab(o))
    mt = tabref(tabV(o)->metatable);
  else if (tvisudata(o))
    mt = tabref(udataV(o)->metatable);
  else
    mt = tabref(basemt_obj(G(L), o));
  if (mt == NULL)
    return 0;
  settabV(L, L->top, mt);
  incr_top(L);
  return 1;
}